

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3BtreeCount(sqlite3 *db,BtCursor *pCur,i64 *pnEntry)

{
  ushort uVar1;
  int iVar2;
  MemPage *pMVar3;
  byte *pbVar4;
  ushort uVar5;
  long lVar6;
  
  iVar2 = moveToRoot(pCur);
  if (iVar2 == 0x10) {
    *pnEntry = 0;
    iVar2 = 0;
  }
  else if (iVar2 == 0) {
    lVar6 = 0;
    do {
      if ((db->u1).isInterrupted != 0) {
        return 0;
      }
      pMVar3 = pCur->pPage;
      if (pMVar3->leaf == '\0') {
        uVar5 = pMVar3->nCell;
        if (pMVar3->intKey == '\0') {
          lVar6 = lVar6 + (ulong)uVar5;
        }
      }
      else {
        lVar6 = lVar6 + (ulong)pMVar3->nCell;
        do {
          if (pCur->iPage == '\0') {
            *pnEntry = lVar6;
            iVar2 = moveToRoot(pCur);
            return iVar2;
          }
          moveToParent(pCur);
          pMVar3 = pCur->pPage;
          uVar5 = pMVar3->nCell;
        } while (uVar5 <= pCur->ix);
        pCur->ix = pCur->ix + 1;
      }
      uVar1 = pCur->ix;
      if (uVar1 == uVar5) {
        pbVar4 = pMVar3->aData + (ulong)pMVar3->hdrOffset + 0xb;
      }
      else {
        pbVar4 = pMVar3->aData +
                 (ulong)(CONCAT11(pMVar3->aCellIdx[(ulong)uVar1 * 2],
                                  pMVar3->aCellIdx[(ulong)uVar1 * 2 + 1]) & pMVar3->maskPage) + 3;
      }
      iVar2 = moveToChild(pCur,(uint)*pbVar4 |
                               (uint)pbVar4[-1] << 8 |
                               (uint)pbVar4[-2] << 0x10 | (uint)pbVar4[-3] << 0x18);
    } while (iVar2 == 0);
  }
  return iVar2;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeCount(sqlite3 *db, BtCursor *pCur, i64 *pnEntry){
  i64 nEntry = 0;                      /* Value to return in *pnEntry */
  int rc;                              /* Return code */

  rc = moveToRoot(pCur);
  if( rc==SQLITE_EMPTY ){
    *pnEntry = 0;
    return SQLITE_OK;
  }

  /* Unless an error occurs, the following loop runs one iteration for each
  ** page in the B-Tree structure (not including overflow pages).
  */
  while( rc==SQLITE_OK && !AtomicLoad(&db->u1.isInterrupted) ){
    int iIdx;                          /* Index of child node in parent */
    MemPage *pPage;                    /* Current page of the b-tree */

    /* If this is a leaf page or the tree is not an int-key tree, then
    ** this page contains countable entries. Increment the entry counter
    ** accordingly.
    */
    pPage = pCur->pPage;
    if( pPage->leaf || !pPage->intKey ){
      nEntry += pPage->nCell;
    }

    /* pPage is a leaf node. This loop navigates the cursor so that it
    ** points to the first interior cell that it points to the parent of
    ** the next page in the tree that has not yet been visited. The
    ** pCur->aiIdx[pCur->iPage] value is set to the index of the parent cell
    ** of the page, or to the number of cells in the page if the next page
    ** to visit is the right-child of its parent.
    **
    ** If all pages in the tree have been visited, return SQLITE_OK to the
    ** caller.
    */
    if( pPage->leaf ){
      do {
        if( pCur->iPage==0 ){
          /* All pages of the b-tree have been visited. Return successfully. */
          *pnEntry = nEntry;
          return moveToRoot(pCur);
        }
        moveToParent(pCur);
      }while ( pCur->ix>=pCur->pPage->nCell );

      pCur->ix++;
      pPage = pCur->pPage;
    }

    /* Descend to the child node of the cell that the cursor currently
    ** points at. This is the right-child if (iIdx==pPage->nCell).
    */
    iIdx = pCur->ix;
    if( iIdx==pPage->nCell ){
      rc = moveToChild(pCur, get4byte(&pPage->aData[pPage->hdrOffset+8]));
    }else{
      rc = moveToChild(pCur, get4byte(findCell(pPage, iIdx)));
    }
  }

  /* An error has occurred. Return an error code. */
  return rc;
}